

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O3

uc_afl_ret __thiscall UCAFL::_afl_next(UCAFL *this,bool crash_found)

{
  undefined8 in_RAX;
  ssize_t sVar1;
  uc_afl_ret uVar2;
  undefined7 in_register_00000031;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  afl_child_ret msg;
  char tmp [4];
  undefined4 local_18;
  undefined4 local_14;
  
  _local_18 = CONCAT44((int)((ulong)in_RAX >> 0x20),(int)CONCAT71(in_register_00000031,crash_found))
  ;
  sVar1 = write(this->afl_child_pipe_[1],&local_18,4);
  __x = extraout_XMM0_Qa;
  if ((sVar1 == 4) &&
     (sVar1 = read(this->afl_parent_pipe_[0],&local_14,4), __x = extraout_XMM0_Qa_00, sVar1 == 4)) {
    uVar2 = UC_AFL_RET_OK;
    memset(this->afl_area_ptr_,0,0x10000);
    this->afl_prev_loc_ = 0;
    *this->afl_area_ptr_ = '\x01';
  }
  else {
    log(__x);
    uVar2 = UC_AFL_RET_ERROR;
  }
  return uVar2;
}

Assistant:

uc_afl_ret _afl_next(bool crash_found) {

        enum afl_child_ret msg =
            crash_found ? AFL_CHILD_FOUND_CRASH : AFL_CHILD_NEXT;
        char tmp[4];

#if defined(AFL_DEBUG)
        ERR("[d] request next. crash found: %s\n",
            crash_found ? "true" : "false");
#endif

        mem_barrier(); // Make very sure everything has been written to the map
                       // at this point

        if (write(_W(this->afl_child_pipe_), &msg, sizeof(msg)) !=
            sizeof(msg)) {

            ERR("[!] Error writing to parent pipe. Parent dead?\n");
            return UC_AFL_RET_ERROR;
        }

        // Once the parent has written something, the next persistent loop
        // starts. The parent itself will wait for AFL to signal the new
        // testcases is available. This blocks until the next testcase is ready.
        if (read(_R(this->afl_parent_pipe_), tmp, 4) != 4) {

            ERR("[!] Error reading from parent pipe. Parent dead?\n");
            return UC_AFL_RET_ERROR;
        }

        /* For shared map fuzzing, the forkserver parent forwards the size of
         * the current testcase. */
        memset(this->afl_area_ptr_, 0, MAP_SIZE);
        mem_barrier(); // Also make sure nothing read before this point.

        // Start with a clean slate.
        this->afl_prev_loc_ = 0;
        this->afl_area_ptr_[0] = 1;

        return UC_AFL_RET_OK;
    }